

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O1

int Ivy_NodeCompareSims(Ivy_FraigMan_t *p,Ivy_Obj_t *pObj0,Ivy_Obj_t *pObj1)

{
  long lVar1;
  
  if (0 < (long)p->nSimWords) {
    lVar1 = 0;
    do {
      if (*(int *)((long)&pObj0->pFanout->pFanout + lVar1 * 4) !=
          *(int *)((long)&pObj1->pFanout->pFanout + lVar1 * 4)) {
        return 0;
      }
      lVar1 = lVar1 + 1;
    } while (p->nSimWords != lVar1);
  }
  return 1;
}

Assistant:

int Ivy_NodeCompareSims( Ivy_FraigMan_t * p, Ivy_Obj_t * pObj0, Ivy_Obj_t * pObj1 )
{
    Ivy_FraigSim_t * pSims0, * pSims1;
    int i;
    pSims0 = Ivy_ObjSim(pObj0);
    pSims1 = Ivy_ObjSim(pObj1);
    for ( i = 0; i < p->nSimWords; i++ )
        if ( pSims0->pData[i] != pSims1->pData[i] )
            return 0;
    return 1;
}